

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O2

void * __thiscall FileHdrWrapper::getFieldPtr(FileHdrWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  
  iVar1 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    switch(fieldId) {
    case 1:
      pvVar2 = (void *)((long)pvVar2 + 2);
      break;
    case 2:
      pvVar2 = (void *)((long)pvVar2 + 4);
      break;
    case 3:
      pvVar2 = (void *)((long)pvVar2 + 8);
      break;
    case 4:
      pvVar2 = (void *)((long)pvVar2 + 0xc);
      break;
    case 5:
      pvVar2 = (void *)((long)pvVar2 + 0x10);
      break;
    case 6:
      pvVar2 = (void *)((long)pvVar2 + 0x12);
    }
  }
  return pvVar2;
}

Assistant:

void* FileHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    IMAGE_FILE_HEADER * hdr = reinterpret_cast<IMAGE_FILE_HEADER*>(getPtr());
    if (!hdr) return NULL;

    IMAGE_FILE_HEADER &fileHeader = (*hdr);
    switch (fieldId) {
         case MACHINE: return (void*) &fileHeader.Machine;
         case SEC_NUM: return (void*) &fileHeader.NumberOfSections;
         case TIMESTAMP: return (void*) &fileHeader.TimeDateStamp;
         case SYMBOL_PTR: return (void*) &fileHeader.PointerToSymbolTable;
         case SYMBOL_NUM: return (void*) &fileHeader.NumberOfSymbols;
         case OPTHDR_SIZE: return (void*) &fileHeader.SizeOfOptionalHeader;
         case CHARACT: return (void*) &fileHeader.Characteristics;
    }
    return (void*) &fileHeader;
}